

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::CheckShadyLeftObject
          (SimpleLeftObjectsDetector *this,CTrackingObject *obj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_> *this_00;
  value_type local_54;
  uint local_38;
  int local_34;
  
  iVar1 = CTrackingObject::get_left_frames(obj);
  if (iVar1 == this->left_object_time0) {
    local_38 = obj->uid;
    local_34 = CTrackingObject::get_left_frames(obj);
    iVar1 = CTrackingObject::get_left(obj);
    iVar2 = CTrackingObject::get_right(obj);
    iVar3 = CTrackingObject::get_top(obj);
    local_54.super_CLeftObjView.rect.bottom = CTrackingObject::get_bottom(obj);
    local_54.super_CLeftObjView.obj_uid = local_38;
    local_54.not_detect_time = 0;
    __position._M_node =
         (this->shady_left_objects).
         super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    this_00 = &this->shady_left_objects;
    local_54.super_CLeftObjView.rect.left = iVar1;
    local_54.super_CLeftObjView.rect.right = iVar2;
    local_54.super_CLeftObjView.rect.top = iVar3;
    while (__position._M_node != (_List_node_base *)this_00) {
      iVar1 = *(int *)((long)&__position._M_node[1]._M_next + 4);
      iVar2 = *(int *)&__position._M_node[1]._M_prev;
      iVar3 = CTrackingObject::get_last_center_x(obj);
      iVar3 = (iVar1 + iVar2) / 2 - iVar3;
      iVar1 = -iVar3;
      if (0 < iVar3) {
        iVar1 = iVar3;
      }
      iVar2 = CTrackingObject::get_left_epsilon(obj);
      if (iVar1 < iVar2 * 2) {
        iVar1 = *(int *)((long)&__position._M_node[1]._M_prev + 4);
        iVar2 = *(int *)&__position._M_node[2]._M_next;
        iVar3 = CTrackingObject::get_last_center_y(obj);
        iVar3 = (iVar1 + iVar2) / 2 - iVar3;
        iVar1 = -iVar3;
        if (0 < iVar3) {
          iVar1 = iVar3;
        }
        iVar2 = CTrackingObject::get_left_epsilon(obj);
        if (iVar2 * 2 <= iVar1) goto LAB_00118aac;
        local_34 = local_34 + *(int *)&__position._M_node[1]._M_next;
        __position = std::__cxx11::
                     list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
                     erase(this_00,__position._M_node);
      }
      else {
LAB_00118aac:
        __position._M_node = (__position._M_node)->_M_next;
      }
    }
    local_54.super_CLeftObjView.life_time = local_34;
    std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
    push_back(this_00,&local_54);
    CTrackingObject::set_left_frames(obj,local_54.super_CLeftObjView.life_time);
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::CheckShadyLeftObject(
        CTrackingObject& obj
        )
{
    if (obj.get_left_frames() == left_object_time0)
    {
        CShadyLeftObj new_obj(obj.uid, obj.get_left_frames(), obj.get_left(), obj.get_right(), obj.get_top(), obj.get_bottom());
        // Если существует объект с центром в некоторой окрестности, то его удаляем а время складываем
        for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
        {
            if ((abs(iter->rect.center_x() - obj.get_last_center_x()) < 2 * obj.get_left_epsilon()) &&
                    (abs(iter->rect.center_y() - obj.get_last_center_y()) < 2 * obj.get_left_epsilon()))
            {
                new_obj.life_time += iter->life_time;
                iter = shady_left_objects.erase(iter);
            }
            else
            {
                ++iter;
            }
        }
        shady_left_objects.push_back(new_obj);
        obj.set_left_frames(new_obj.life_time);
    }
}